

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O2

bool __thiscall
IR::Instr::IterateArgInstrs<BackwardPass::ProcessInlineeStart(IR::Instr*)::__0>
          (Instr *this,anon_class_8_1_da3b4f2a callback)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  Instr *pIVar7;
  Instr *argInstr;
  anon_class_8_1_da3b4f2a local_38;
  anon_class_8_1_da3b4f2a callback_local;
  
  local_38.startCallInstr = callback.startCallInstr;
  pSVar4 = Opnd::GetStackSym(this->m_src2);
  argInstr = (pSVar4->field_5).m_instrDef;
  if ((argInstr != (Instr *)0x0 & pSVar4->field_0x18) == 1) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar2) {
LAB_003d561b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    argInstr = (pSVar4->field_5).m_instrDef;
  }
  do {
    if (argInstr->m_src2 == (Opnd *)0x0) {
LAB_003d559e:
      pIVar7 = (Instr *)0x0;
    }
    else {
      bVar2 = Opnd::IsSymOpnd(argInstr->m_src2);
      if (!bVar2) goto LAB_003d559e;
      pSVar6 = Opnd::AsSymOpnd(argInstr->m_src2);
      pSVar4 = Sym::AsStackSym(pSVar6->m_sym);
      bVar2 = StackSym::IsArgSlotSym(pSVar4);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar2) goto LAB_003d561b;
        *puVar5 = 0;
      }
      if (((pSVar4->field_0x18 & 1) == 0) || ((pSVar4->field_5).m_instrDef == (Instr *)0x0)) {
        bVar2 = Func::IsInPhase(this->m_func,FGPeepsPhase);
        if (!bVar2) {
          bVar2 = Func::IsInPhase(this->m_func,FGBuildPhase);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar2) goto LAB_003d561b;
            *puVar5 = 0;
          }
        }
      }
      if ((pSVar4->field_0x18 & 1) == 0) goto LAB_003d559e;
      pIVar7 = (pSVar4->field_5).m_instrDef;
    }
    OVar3 = argInstr->m_opcode;
    if (OVar3 != ArgOut_A_InlineSpecialized) {
      if (OVar3 == StartCall) {
        if (pIVar7 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          OVar3 = (OpCode)bVar2;
          if (!bVar2) goto LAB_003d561b;
          *puVar5 = 0;
        }
        break;
      }
      bVar2 = BackwardPass::ProcessInlineeStart::anon_class_8_1_da3b4f2a::operator()
                        (&local_38,argInstr);
      OVar3 = (OpCode)bVar2;
    }
    argInstr = pIVar7;
  } while (pIVar7 != (Instr *)0x0);
  return SUB21(OVar3,0);
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }